

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O3

uvec4 ImageCodec::decodeUINT_UINTVec<unsigned_int,3>(ImageCodec *param_1,void *ptr)

{
  uvec4 uVar1;
  
  uVar1.field_0.field_0.w = 0;
  uVar1.field_0._0_12_ = *ptr;
  return (uvec4)uVar1.field_0;
}

Assistant:

static glm::uvec4 decodeUINT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::uvec4 result(0, 0, 0, 0);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }